

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::crate::CrateReader::ReadCompressedInts<int>(CrateReader *this,int *out,size_t num_ints)

{
  pointer *ppcVar1;
  StreamReader *pSVar2;
  uint64_t uVar3;
  bool bVar4;
  ostream *poVar5;
  size_t __new_size;
  ulong uVar6;
  size_t sVar7;
  unsigned_long *in_R8;
  size_t nbytes;
  size_t __n;
  uint64_t compSize;
  vector<char,_std::allocator<char>_> compBuffer;
  ostringstream ss_e;
  ulong local_1f8;
  undefined1 local_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  vector<char,_std::allocator<char>_> local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f0._0_8_ = num_ints;
  if ((this->_config).maxInts < num_ints) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"ReadCompressedInts",0x12);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x12f);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ppcVar1 = &local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)ppcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c8,"# of ints {} too large. maxInts is set to {}","");
    fmt::format<unsigned_long,unsigned_long>
              ((string *)(local_1f0 + 8),(fmt *)&local_1c8,(string *)local_1f0,
               &(this->_config).maxInts,in_R8);
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_1f0._8_8_,local_1e0._M_allocated_capacity
                       );
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((char *)local_1f0._8_8_ != local_1e0._M_local_buf + 8) {
      operator_delete((void *)local_1f0._8_8_,local_1e0._8_8_ + 1);
    }
    if ((pointer *)
        local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != ppcVar1) {
      operator_delete(local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (ulong)(local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1));
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,local_1f0._8_8_);
    if ((char *)local_1f0._8_8_ == local_1e0._M_local_buf + 8) goto LAB_001d6382;
  }
  else {
    __new_size = Usd_IntegerCompression::GetCompressedBufferSize(num_ints);
    uVar6 = this->_memoryUsage + __new_size;
    this->_memoryUsage = uVar6;
    if (uVar6 <= (this->_config).maxMemoryBudget) {
      bVar4 = StreamReader::read8(this->_sr,&local_1f8);
      if (!bVar4) {
        return false;
      }
      if (__new_size < local_1f8) {
        local_1f8 = __new_size;
      }
      if (local_1f8 < 4) {
        return false;
      }
      if (this->_sr->length_ < local_1f8) {
        return false;
      }
      local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (char *)0x0;
      local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ::std::vector<char,_std::allocator<char>_>::resize(&local_1c8,__new_size);
      pSVar2 = this->_sr;
      uVar3 = pSVar2->idx_;
      __n = pSVar2->length_ - uVar3;
      if (uVar3 + local_1f8 <= pSVar2->length_) {
        __n = local_1f8;
      }
      if (__n - 1 < local_1f8) {
        memcpy(local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,pSVar2->binary_ + uVar3,__n);
        pSVar2->idx_ = pSVar2->idx_ + __n;
        if (__n != 0) {
          sVar7 = Usd_IntegerCompression::DecompressFromBuffer
                            (local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start,local_1f8,out,local_1f0._0_8_,
                             &this->_err,(char *)0x0);
          bVar4 = sVar7 != 0;
          if (this->_memoryUsage < __new_size) {
            this->_memoryUsage = this->_memoryUsage - __new_size;
          }
          goto LAB_001d6706;
        }
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ReadCompressedInts",0x12);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x153);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Failed to read compressedInts.",0x1e);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,local_1f0._8_8_);
      if ((char *)local_1f0._8_8_ != local_1e0._M_local_buf + 8) {
        operator_delete((void *)local_1f0._8_8_,local_1e0._8_8_ + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
      ::std::ios_base::~ios_base(local_138);
      bVar4 = false;
LAB_001d6706:
      if (local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (char *)0x0) {
        operator_delete(local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
        return bVar4;
      }
      return bVar4;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"ReadCompressedInts",0x12);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x139);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Reached to max memory budget.",0x1d);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,local_1f0._8_8_);
    if ((char *)local_1f0._8_8_ == local_1e0._M_local_buf + 8) goto LAB_001d6382;
  }
  operator_delete((void *)local_1f0._8_8_,local_1e0._8_8_ + 1);
LAB_001d6382:
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool CrateReader::ReadCompressedInts(Int *out,
                                     size_t num_ints) {
  if (num_ints > _config.maxInts) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("# of ints {} too large. maxInts is set to {}", num_ints, _config.maxInts));
  }

  using Compressor =
      typename std::conditional<sizeof(Int) == 4, Usd_IntegerCompression,
                                Usd_IntegerCompression64>::type;


  // TODO: Read compressed data from _sr directly
  size_t compBufferSize = Compressor::GetCompressedBufferSize(num_ints);
  CHECK_MEMORY_USAGE(compBufferSize);

  uint64_t compSize;
  if (!_sr->read8(&compSize)) {
    return false;
  }

  if (compSize > compBufferSize) {
    // Truncate
    // TODO: return error?
    compSize = compBufferSize;
  }

  if (compSize > _sr->size()) {
    return false;
  }

  if (compSize < 4) {
    // Too small
    return false;
  }

  std::vector<char> compBuffer;
  compBuffer.resize(compBufferSize);
  if (!_sr->read(size_t(compSize), size_t(compSize),
                reinterpret_cast<uint8_t *>(compBuffer.data()))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read compressedInts.");
  }

  bool ret = Compressor::DecompressFromBuffer(
      compBuffer.data(), size_t(compSize), out, num_ints, &_err);

  REDUCE_MEMORY_USAGE(compBufferSize);

  return ret;
}